

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

shared_ptr<minja::Expression> __thiscall
minja::Parser::parseExpression(Parser *this,bool allow_if_expr)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  int iVar2;
  char in_DL;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined7 in_register_00000031;
  Parser *this_00;
  shared_ptr<minja::Expression> sVar3;
  shared_ptr<minja::Expression> left;
  string local_70;
  Location location;
  Location local_38;
  
  this_00 = (Parser *)CONCAT71(in_register_00000031,allow_if_expr);
  parseLogicalOr((Parser *)&left);
  if (((this_00->it)._M_current != (this_00->end)._M_current) && (in_DL != '\0')) {
    if (parseExpression(bool)::if_tok_abi_cxx11_ == '\0') {
      iVar2 = __cxa_guard_acquire(&parseExpression(bool)::if_tok_abi_cxx11_);
      if (iVar2 != 0) {
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                  (&parseExpression(bool)::if_tok_abi_cxx11_,"if\\b",0x10);
        __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                     ~basic_regex,&parseExpression(bool)::if_tok_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&parseExpression(bool)::if_tok_abi_cxx11_);
      }
    }
    consumeToken(&local_70,this_00,&parseExpression(bool)::if_tok_abi_cxx11_,Strip);
    std::__cxx11::string::~string((string *)&local_70);
    if ((char *)local_70._M_string_length != (char *)0x0) {
      get_location(&location,this_00);
      parseIfExpression((pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_>
                         *)&local_70,this_00);
      std::
      make_shared<minja::IfExpr,minja::Location&,std::shared_ptr<minja::Expression>,std::shared_ptr<minja::Expression>,std::shared_ptr<minja::Expression>>
                (&local_38,(shared_ptr<minja::Expression> *)&location,
                 (shared_ptr<minja::Expression> *)&local_70,&left);
      _Var1._M_pi = local_38.source.
                    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      local_38.source.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (this->template_str).
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = local_38.source.
                super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      (this->template_str).
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = _Var1._M_pi;
      local_38.source.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_38.source.
                  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_>::~pair
                ((pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_> *)
                 &local_70);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&location.source.
                  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      goto LAB_001a4362;
    }
  }
  _Var1._M_pi = left.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  left.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->template_str).
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)
            left.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->template_str).
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var1._M_pi;
  left.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
LAB_001a4362:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&left.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  sVar3.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<minja::Expression>)
         sVar3.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Expression> parseExpression(bool allow_if_expr = true) {
        auto left = parseLogicalOr();
        if (it == end) return left;

        if (!allow_if_expr) return left;

        static std::regex if_tok(R"(if\b)");
        if (consumeToken(if_tok).empty()) {
          return left;
        }

        auto location = get_location();
        auto [condition, else_expr] = parseIfExpression();
        return std::make_shared<IfExpr>(location, std::move(condition), std::move(left), std::move(else_expr));
    }